

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ColorButton(char *desc_id,ImVec4 *col,ImGuiColorEditFlags flags,ImVec2 size)

{
  ImGuiWindow *this;
  ImVec2 grid_off;
  ImVec2 grid_off_00;
  float h;
  float s;
  float v;
  float fVar1;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  ImGuiID IVar5;
  ImU32 IVar6;
  ImVec4 *pIVar7;
  uint flags_00;
  ImDrawList *pIVar8;
  char *type;
  ImDrawFlags flags_01;
  float fVar9;
  float fVar10;
  uint uVar11;
  size_t sStack_120;
  bool hovered;
  ImGuiID local_110;
  bool held;
  ImVec4 col_rgb;
  ImVec2 local_e8;
  ImVec2 IStack_e0;
  ImRect bb;
  float local_c8;
  float fStack_c4;
  ImVec4 col_source;
  ImVec4 local_98;
  undefined1 local_88 [16];
  ImVec2 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  IVar5 = ImGuiWindow::GetID(this,desc_id,(char *)0x0);
  fVar9 = GetFrameHeight();
  local_c8 = size.x;
  fStack_c4 = size.y;
  fVar10 = 0.0;
  if ((local_c8 == 0.0) && (!NAN(local_c8))) {
    local_c8 = fVar9;
  }
  if ((fStack_c4 == 0.0) && (!NAN(fStack_c4))) {
    fStack_c4 = fVar9;
  }
  bb.Min.x = (this->DC).CursorPos.x;
  bb.Min.y = (this->DC).CursorPos.y;
  bb.Max.x = bb.Min.x + local_c8;
  bb.Max.y = bb.Min.y + fStack_c4;
  if (fVar9 <= fStack_c4) {
    fVar10 = (pIVar2->Style).FramePadding.y;
  }
  local_110 = IVar5;
  ItemSize(&bb,fVar10);
  IVar5 = local_110;
  bVar3 = ItemAdd(&bb,local_110,(ImRect *)0x0,0);
  if (!bVar3) {
    return false;
  }
  bVar3 = ButtonBehavior(&bb,IVar5,&hovered,&held,0);
  flags_00 = flags & 0xfff9ffff;
  if ((flags & 2U) == 0) {
    flags_00 = flags;
  }
  h = col->x;
  s = col->y;
  v = col->z;
  fVar1 = col->w;
  col_rgb.x = h;
  col_rgb.y = s;
  col_rgb.z = v;
  col_rgb.w = fVar1;
  if ((flags_00 >> 0x1c & 1) != 0) {
    ColorConvertHSVtoRGB(h,s,v,&col_rgb.x,&col_rgb.y,&col_rgb.z);
  }
  local_98.x = col_rgb.x;
  local_98.y = col_rgb.y;
  local_98.z = col_rgb.z;
  if (fStack_c4 <= local_c8) {
    local_c8 = fStack_c4;
  }
  local_c8 = local_c8 / 2.99;
  local_98.w = 1.0;
  fVar10 = (pIVar2->Style).FrameRounding;
  local_e8.y = bb.Min.y;
  local_e8.x = bb.Min.x;
  IStack_e0.y = bb.Max.y;
  IStack_e0.x = bb.Max.x;
  uVar11 = 0;
  if ((flags_00 >> 10 & 1) == 0) {
    local_e8.y = bb.Min.y + 0.75;
    local_e8.x = bb.Min.x + 0.75;
    IStack_e0.y = bb.Max.y + -0.75;
    IStack_e0.x = bb.Max.x + -0.75;
    uVar11 = 0xbf400000;
  }
  if (local_c8 * 0.5 <= fVar10) {
    fVar10 = local_c8 * 0.5;
  }
  if (((flags_00 >> 0x12 & 1) == 0) || (1.0 <= col_rgb.w)) {
    pIVar7 = &col_rgb;
    if ((flags_00 >> 0x11 & 1) == 0) {
      pIVar7 = &local_98;
    }
    col_source.x = pIVar7->x;
    col_source.y = pIVar7->y;
    col_source.z = pIVar7->z;
    col_source.w = pIVar7->w;
    pIVar8 = this->DrawList;
    if (col_source.w < 1.0) {
      local_78 = local_e8;
      uStack_70 = 0;
      local_88._8_8_ = 0;
      local_88._0_4_ = IStack_e0.x;
      local_88._4_4_ = IStack_e0.y;
      local_68 = ZEXT416(uVar11);
      IVar6 = GetColorU32(&col_source);
      grid_off.y = (float)local_68._0_4_;
      grid_off.x = (float)local_68._0_4_;
      RenderColorRectWithAlphaCheckerboard
                (pIVar8,local_78,(ImVec2)local_88._0_8_,IVar6,local_c8,grid_off,fVar10,0);
      goto LAB_00157495;
    }
    IVar6 = GetColorU32(&col_source);
    pIVar7 = (ImVec4 *)&IStack_e0;
    flags_01 = 0;
  }
  else {
    local_68 = ZEXT416(uVar11);
    local_88 = ZEXT416((uint)(float)(int)((IStack_e0.x + local_e8.x) * 0.5 + 0.5));
    pIVar8 = this->DrawList;
    local_48 = IStack_e0;
    uStack_40 = 0;
    local_58.y = local_e8.y;
    local_58.x = local_e8.x + local_c8;
    uStack_50 = 0;
    local_78 = (ImVec2)desc_id;
    IVar6 = GetColorU32(&col_rgb);
    grid_off_00.y = (float)local_68._0_4_;
    grid_off_00.x = (float)local_68._0_4_ - local_c8;
    RenderColorRectWithAlphaCheckerboard
              (pIVar8,local_58,local_48,IVar6,local_c8,grid_off_00,fVar10,0xa0);
    pIVar8 = this->DrawList;
    pIVar7 = &col_source;
    col_source.y = IStack_e0.y;
    col_source.x = (float)local_88._0_4_;
    IVar6 = GetColorU32(&local_98);
    flags_01 = 0x50;
    desc_id = (char *)local_78;
  }
  ImDrawList::AddRectFilled(pIVar8,&local_e8,(ImVec2 *)pIVar7,IVar6,fVar10,flags_01);
LAB_00157495:
  RenderNavHighlight(&bb,local_110,1);
  if ((flags_00 >> 10 & 1) == 0) {
    if ((pIVar2->Style).FrameBorderSize <= 0.0) {
      pIVar8 = this->DrawList;
      IVar6 = GetColorU32(7,1.0);
      ImDrawList::AddRect(pIVar8,&bb.Min,&bb.Max,IVar6,fVar10,0,1.0);
    }
    else {
      p_min.y = bb.Min.y;
      p_min.x = bb.Min.x;
      p_max.y = bb.Max.y;
      p_max.x = bb.Max.x;
      RenderFrameBorder(p_min,p_max,fVar10);
    }
  }
  if ((((flags_00 >> 9 & 1) == 0) && (pIVar2->ActiveId == local_110)) &&
     (bVar4 = BeginDragDropSource(0), bVar4)) {
    if ((flags_00 & 2) == 0) {
      type = "_COL4F";
      sStack_120 = 0x10;
    }
    else {
      type = "_COL3F";
      sStack_120 = 0xc;
    }
    SetDragDropPayload(type,&col_rgb,sStack_120,2);
    ColorButton(desc_id,col,flags_00,(ImVec2)0x0);
    SameLine(0.0,-1.0);
    TextEx("Color",(char *)0x0,0);
    EndDragDropSource();
  }
  if (((flags_00 & 0x40) == 0) && (hovered == true)) {
    ColorTooltip(desc_id,&col->x,flags_00 & 0x18060002);
  }
  return bVar3;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}